

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O3

longdouble *
anon_unknown.dwarf_8ba60::roundtrip<long_double>(longdouble *__return_storage_ptr__,longdouble *in)

{
  long lVar1;
  longdouble *plVar2;
  Result *in_R9;
  stringstream stream;
  undefined1 auStack_1e8 [12];
  ExpressionDecomposer local_1dc;
  Expression_lhs<unsigned_long> local_1d8;
  Result local_1c8;
  unsigned_long local_1a0;
  long local_198 [2];
  char local_188 [12];
  undefined4 auStack_17c [25];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  lVar1 = *(long *)(local_198[0] + -0x18);
  *(undefined4 *)((long)auStack_17c + lVar1) = 4;
  std::ios::clear((int)auStack_1e8 + (int)lVar1 + 0x50);
  local_1c8._0_10_ = *__return_storage_ptr__;
  std::ostream::write(local_188,(long)&local_1c8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1dc,DT_CHECK);
  local_1d8.lhs = std::ostream::tellp();
  local_1d8.m_at = local_1dc.m_at;
  local_1a0 = 0x10;
  doctest::detail::Expression_lhs<unsigned_long>::operator==(&local_1c8,&local_1d8,&local_1a0);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x1b61dc,(char *)0x36,0x1b643d,&local_1c8.m_passed,in_R9);
  doctest::String::~String((String *)((long)&local_1c8 + 8));
  std::istream::read((char *)local_198,(long)&local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  plVar2 = (longdouble *)std::ios_base::~ios_base(local_118);
  return plVar2;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}